

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall CTape::CTape(CTape *this,int tape_lentgh)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  ostream *poVar5;
  double __x;
  string local_1f0 [32];
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_char,_int>_> local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_char,_int>_> local_30;
  const_iterator i_1;
  char i;
  allocator<CNumber<27>_> local_15;
  int local_14;
  CTape *pCStack_10;
  int tape_lentgh_local;
  CTape *this_local;
  
  local_14 = tape_lentgh;
  pCStack_10 = this;
  std::allocator<CNumber<27>_>::allocator(&local_15);
  std::vector<CNumber<27>,_std::allocator<CNumber<27>_>_>::vector
            (&this->m_tape,(long)tape_lentgh,&local_15);
  std::allocator<CNumber<27>_>::~allocator(&local_15);
  CNumber<30>::CNumber(&this->m_pos);
  std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
            (&this->m_l2t);
  i_1._M_node._3_1_ = 0x20;
  pmVar3 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
           operator[](&this->m_l2t,(key_type *)((long)&i_1._M_node + 3));
  *pmVar3 = 0;
  for (i_1._M_node._2_1_ = 'A'; i_1._M_node._2_1_ < '[';
      i_1._M_node._2_1_ = i_1._M_node._2_1_ + '\x01') {
    iVar2 = (int)i_1._M_node._2_1_;
    pmVar3 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&this->m_l2t,(key_type *)((long)&i_1._M_node + 2));
    *pmVar3 = iVar2 + -0x40;
  }
  local_38._M_node =
       (_Base_ptr)
       std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::begin
                 (&this->m_l2t);
  std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::_Rb_tree_const_iterator
            (&local_30,&local_38);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                   (&this->m_l2t);
    std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::_Rb_tree_const_iterator
              (&local_40,&local_48);
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    std::__cxx11::stringstream::stringstream(local_1d0);
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::operator->(&local_30);
    poVar5 = std::operator<<(local_1c0,ppVar4->first);
    poVar5 = std::operator<<(poVar5," -> ");
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::operator->(&local_30);
    std::ostream::operator<<(poVar5,ppVar4->second);
    __x = (double)std::__cxx11::stringstream::str();
    debug::log(__x);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::stringstream::~stringstream(local_1d0);
    std::_Rb_tree_const_iterator<std::pair<const_char,_int>_>::operator++(&local_30);
  }
  return;
}

Assistant:

CTape(const int tape_lentgh = TAPE_LENGTH): m_tape(tape_lentgh)
        {
            m_l2t[' '] = 0;
            for (char i = 'A'; i <= 'Z'; ++i)
            {
                m_l2t[i] = i - 'A' + 1;
            }
            for (l2t_t::const_iterator i = m_l2t.begin(); i != m_l2t.end(); ++i)
            {
                std::stringstream ss;
                ss << i->first << " -> " << i->second;
                debug::log(ss.str());
            }
        }